

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddAddNonSimComposeRecur
                   (DdManager *dd,DdNode *f,DdNode **vector,DdNode *key,DdNode *cube,int lastsub)

{
  uint i_00;
  DdNode *pDVar1;
  DdNode **vector_00;
  DdNode **vector_01;
  DdNode *h;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  DdNode *gi;
  DdNode **vect0;
  DdNode **vect1;
  int i;
  uint index;
  uint topc;
  uint topk;
  uint topf;
  uint top;
  DdNode *r;
  DdNode *E;
  DdNode *T;
  DdNode *var;
  DdNode *cube1;
  DdNode *key0;
  DdNode *key1;
  DdNode *f0;
  DdNode *f1;
  int lastsub_local;
  DdNode *cube_local;
  DdNode *key_local;
  DdNode **vector_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (cube == dd->one) {
    return f;
  }
  if (f->index == 0x7fffffff) {
    return f;
  }
  pDVar1 = cuddCacheLookup(dd,0x46,f,key,cube);
  if (pDVar1 != (DdNode *)0x0) {
    return pDVar1;
  }
  if (f->index == 0x7fffffff) {
    local_bc = f->index;
  }
  else {
    local_bc = dd->perm[f->index];
  }
  if (key->index == 0x7fffffff) {
    local_c0 = key->index;
  }
  else {
    local_c0 = dd->perm[key->index];
  }
  if (local_c0 < local_bc) {
    local_c4 = local_c0;
  }
  else {
    local_c4 = local_bc;
  }
  if (cube->index == 0x7fffffff) {
    local_c8 = cube->index;
  }
  else {
    local_c8 = dd->perm[cube->index];
  }
  if (local_c8 < local_c4) {
    local_cc = local_c8;
  }
  else {
    local_cc = local_c4;
  }
  i_00 = dd->invperm[local_cc];
  key1 = f;
  f0 = f;
  if (local_bc == local_cc) {
    f0 = (f->type).kids.T;
    key1 = (f->type).kids.E;
  }
  if (local_c8 == local_cc) {
    var = (cube->type).kids.T;
    pDVar1 = Cudd_addIthVar(dd,i_00);
    if (pDVar1 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    cube1 = cuddAddExistAbstractRecur(dd,key,pDVar1);
    if (cube1 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar1);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)cube1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)cube1 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,pDVar1);
    key0 = cube1;
  }
  else {
    cube1 = key;
    key0 = key;
    if (local_c0 == local_cc) {
      key0 = (key->type).kids.T;
      cube1 = (key->type).kids.E;
    }
    *(int *)(((ulong)key0 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)key0 & 0xfffffffffffffffe) + 4) + 1;
    var = cube;
  }
  vector_00 = (DdNode **)malloc((long)lastsub << 3);
  if (vector_00 == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    Cudd_RecursiveDeref(dd,key0);
    dd_local = (DdManager *)0x0;
  }
  else {
    vector_01 = (DdNode **)malloc((long)lastsub << 3);
    if (vector_01 == (DdNode **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      Cudd_RecursiveDeref(dd,key0);
      if (vector_00 != (DdNode **)0x0) {
        free(vector_00);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      for (vect1._0_4_ = 0; (int)vect1 < lastsub; vect1._0_4_ = (int)vect1 + 1) {
        pDVar1 = vector[(int)vect1];
        if (pDVar1 == (DdNode *)0x0) {
          vector_01[(int)vect1] = (DdNode *)0x0;
          vector_00[(int)vect1] = (DdNode *)0x0;
        }
        else if (pDVar1->index == i_00) {
          vector_00[(int)vect1] = (DdNode *)(pDVar1->type).value;
          vector_01[(int)vect1] = (pDVar1->type).kids.E;
        }
        else {
          vector_01[(int)vect1] = pDVar1;
          vector_00[(int)vect1] = pDVar1;
        }
      }
      vector_01[i_00] = (DdNode *)0x0;
      vector_00[i_00] = (DdNode *)0x0;
      pDVar1 = cuddAddNonSimComposeRecur(dd,f0,vector_00,key0,var,lastsub);
      if (vector_00 != (DdNode **)0x0) {
        free(vector_00);
      }
      if (pDVar1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,key0);
        if (vector_01 != (DdNode **)0x0) {
          free(vector_01);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
        h = cuddAddNonSimComposeRecur(dd,key1,vector_01,cube1,var,lastsub);
        if (vector_01 != (DdNode **)0x0) {
          free(vector_01);
        }
        if (h == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,key0);
          Cudd_RecursiveDeref(dd,pDVar1);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,key0);
          dd_local = (DdManager *)cuddAddIteRecur(dd,vector[i_00],pDVar1,h);
          if (dd_local == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,h);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,pDVar1);
            Cudd_RecursiveDeref(dd,h);
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert(dd,0x46,f,key,cube,(DdNode *)dd_local);
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddAddNonSimComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector,
  DdNode * key,
  DdNode * cube,
  int  lastsub)
{
    DdNode *f1, *f0, *key1, *key0, *cube1, *var;
    DdNode *T,*E;
    DdNode *r;
    unsigned int top, topf, topk, topc;
    unsigned int index;
    int i;
    DdNode **vect1;
    DdNode **vect0;

    statLine(dd);
    /* If we are past the deepest substitution, return f. */
    if (cube == DD_ONE(dd) || cuddIsConstant(f)) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    r = cuddCacheLookup(dd,DD_ADD_NON_SIM_COMPOSE_TAG,f,key,cube);
    if (r != NULL) {
        return(r);
    }

    /* Find top variable. we just need to look at f, key, and cube,
    ** because all the varibles in the gi are in key.
    */
    topf = cuddI(dd,f->index);
    topk = cuddI(dd,key->index);
    top = ddMin(topf,topk);
    topc = cuddI(dd,cube->index);
    top = ddMin(top,topc);
    index = dd->invperm[top];

    /* Compute the cofactors. */
    if (topf == top) {
        f1 = cuddT(f);
        f0 = cuddE(f);
    } else {
        f1 = f0 = f;
    }
    if (topc == top) {
        cube1 = cuddT(cube);
        /* We want to eliminate vector[index] from key. Otherwise
        ** cache performance is severely affected. Hence we
        ** existentially quantify the variable with index "index" from key.
        */
        var = Cudd_addIthVar(dd, (int) index);
        if (var == NULL) {
            return(NULL);
        }
        cuddRef(var);
        key1 = cuddAddExistAbstractRecur(dd, key, var);
        if (key1 == NULL) {
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(key1);
        Cudd_RecursiveDeref(dd,var);
        key0 = key1;
    } else {
        cube1 = cube;
        if (topk == top) {
            key1 = cuddT(key);
            key0 = cuddE(key);
        } else {
            key1 = key0 = key;
        }
        cuddRef(key1);
    }

    /* Allocate two new vectors for the cofactors of vector. */
    vect1 = ABC_ALLOC(DdNode *,lastsub);
    if (vect1 == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd,key1);
        return(NULL);
    }
    vect0 = ABC_ALLOC(DdNode *,lastsub);
    if (vect0 == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd,key1);
        ABC_FREE(vect1);
        return(NULL);
    }

    /* Cofactor the gi. Eliminate vect1[index] and vect0[index], because
    ** we do not need them.
    */
    for (i = 0; i < lastsub; i++) {
        DdNode *gi = vector[i];
        if (gi == NULL) {
            vect1[i] = vect0[i] = NULL;
        } else if (gi->index == index) {
            vect1[i] = cuddT(gi);
            vect0[i] = cuddE(gi);
        } else {
            vect1[i] = vect0[i] = gi;
        }
    }
    vect1[index] = vect0[index] = NULL;

    /* Recur on children. */
    T = cuddAddNonSimComposeRecur(dd,f1,vect1,key1,cube1,lastsub);
    ABC_FREE(vect1);
    if (T == NULL) {
        Cudd_RecursiveDeref(dd,key1);
        ABC_FREE(vect0);
        return(NULL);
    }
    cuddRef(T);
    E = cuddAddNonSimComposeRecur(dd,f0,vect0,key0,cube1,lastsub);
    ABC_FREE(vect0);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,key1);
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    Cudd_RecursiveDeref(dd,key1);

    /* Retrieve the 0-1 ADD for the current top variable from vector,
    ** and call cuddAddIteRecur with the T and E we just created.
    */
    r = cuddAddIteRecur(dd,vector[index],T,E);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddRef(r);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    cuddDeref(r);

    /* Store answer to trim recursion. */
    cuddCacheInsert(dd,DD_ADD_NON_SIM_COMPOSE_TAG,f,key,cube,r);

    return(r);

}